

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidgetPrivate::setMinimumSize_helper(QWidgetPrivate *this,int *minw,int *minh)

{
  int iVar1;
  undefined8 *puVar2;
  QWExtra *pQVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<char> local_70;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *(undefined8 **)&this->field_0x8;
  iVar5 = *minh;
  iVar8 = iVar5;
  if (iVar5 == 0xffffff) {
    iVar8 = 0;
  }
  iVar1 = *minw;
  iVar9 = 0;
  if (iVar1 != 0xffffff) {
    iVar9 = iVar1;
  }
  if ((0xffffff < iVar1) || (0xffffff < iVar5)) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QObject::objectName();
    QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&QStack_88);
    pcVar6 = QByteArray::data((QByteArray *)&local_70);
    (**(code **)*puVar2)(puVar2);
    uVar7 = QMetaObject::className();
    QMessageLogger::warning
              (local_58,"QWidget::setMinimumSize: (%s/%s) The largest allowed size is (%d,%d)",
               pcVar6,uVar7,0xffffff,0xffffff);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    iVar9 = *minw;
    if (0xfffffe < *minw) {
      iVar9 = 0xffffff;
    }
    *minw = iVar9;
    iVar5 = 0xffffff;
    if (*minh < 0xffffff) {
      iVar5 = *minh;
    }
    *minh = iVar5;
    iVar1 = *minw;
    iVar8 = iVar5;
  }
  if ((iVar1 < 0) || (iVar5 < 0)) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QObject::objectName();
    QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&QStack_88);
    pcVar6 = QByteArray::data((QByteArray *)&local_70);
    (**(code **)*puVar2)(puVar2);
    uVar7 = QMetaObject::className();
    QMessageLogger::warning
              (local_58,"QWidget::setMinimumSize: (%s/%s) Negative sizes (%d,%d) are not possible",
               pcVar6,uVar7,(ulong)(uint)*minw,(ulong)(uint)*minh);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    iVar9 = *minw;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    *minw = iVar9;
    iVar8 = 0;
    if (0 < *minh) {
      iVar8 = *minh;
    }
    *minh = iVar8;
  }
  createExtra(this);
  pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar3->minw == iVar9) && (pQVar3->minh == iVar8)) {
    bVar4 = false;
  }
  else {
    pQVar3->minw = iVar9;
    pQVar3->minh = iVar8;
    *(ushort *)&pQVar3->field_0x7c =
         (ushort)*(undefined4 *)&pQVar3->field_0x7c & 0xfffc |
         (ushort)(iVar9 != 0) + (ushort)(iVar8 != 0) * 2;
    bVar4 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::setMinimumSize_helper(int &minw, int &minh)
{
    Q_Q(QWidget);

    int mw = minw, mh = minh;
    if (mw == QWIDGETSIZE_MAX)
        mw = 0;
    if (mh == QWIDGETSIZE_MAX)
        mh = 0;
    if (Q_UNLIKELY(minw > QWIDGETSIZE_MAX || minh > QWIDGETSIZE_MAX)) {
        qWarning("QWidget::setMinimumSize: (%s/%s) "
                "The largest allowed size is (%d,%d)",
                 q->objectName().toLocal8Bit().data(), q->metaObject()->className(), QWIDGETSIZE_MAX,
                QWIDGETSIZE_MAX);
        minw = mw = qMin<int>(minw, QWIDGETSIZE_MAX);
        minh = mh = qMin<int>(minh, QWIDGETSIZE_MAX);
    }
    if (Q_UNLIKELY(minw < 0 || minh < 0)) {
        qWarning("QWidget::setMinimumSize: (%s/%s) Negative sizes (%d,%d) "
                "are not possible",
                q->objectName().toLocal8Bit().data(), q->metaObject()->className(), minw, minh);
        minw = mw = qMax(minw, 0);
        minh = mh = qMax(minh, 0);
    }
    createExtra();
    if (extra->minw == mw && extra->minh == mh)
        return false;
    extra->minw = mw;
    extra->minh = mh;
    extra->explicitMinSize = (mw ? Qt::Horizontal : 0) | (mh ? Qt::Vertical : 0);
    return true;
}